

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O3

void __thiscall kj::std::anon_unknown_0::TestCase64::run(TestCase64 *this)

{
  StdInputStream in;
  byte buf [8];
  StdOutputStream out;
  DebugExpression<bool> local_4f8 [32];
  Fault f;
  stringstream ss;
  char local_338 [376];
  undefined1 local_1c0;
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  in.super_InputStream._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_00226f50;
  in.stream_ = (istream *)&ss;
  ::std::ostream::write(local_338,0x1df0b8);
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  InputStream::read(&in.super_InputStream,(int)buf,(void *)0x8,8);
  local_1c0 = 0;
  local_4f8[0].value = false;
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/std/iostream-test.c++"
             ,0x51,FAILED,"!(e == kj::none)","_kjCondition,",local_4f8);
  _::Debug::Fault::fatal(&f);
}

Assistant:

TEST(StdIoStream, ReadToEndOfFile) {
  // Check that read throws an exception when eof is reached before specified
  // bytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  out.write("foobar"_kjb);

  byte buf[8]{};

  Maybe<Exception> e = kj::runCatchingExceptions([&]() {
    in.read(buf);
  });

  ASSERT_FALSE(e == kj::none);

  // Ensure that the value is still read up to the EOF.
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf).first(6));
}